

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  int argc_00;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  JSValue val;
  JSValue JVar6;
  
  JVar5 = JS_ToObject(ctx,this_val);
  if ((int)JVar5.tag == 6) {
    iVar4 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    argc_00 = 0x5b;
    JVar6 = JVar5;
    val = JS_GetPropertyInternal(ctx,JVar5,0x5b,JVar5,0);
    if ((int)val.tag == 6) {
      JVar6 = (JSValue)(ZEXT816(6) << 0x40);
      uVar3 = 0;
    }
    else {
      iVar1 = JS_IsFunction(ctx,val);
      JVar2 = JVar6.u;
      if (iVar1 == 0) {
        JS_FreeValue(ctx,val);
        JVar6 = js_object_toString(ctx,JVar5,argc_00,(JSValue *)JVar2.ptr);
      }
      else {
        JVar6 = JS_CallFree(ctx,val,JVar5,0,(JSValue *)0x0);
      }
      uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
    }
    iVar4 = JVar6.tag;
    JS_FreeValue(ctx,JVar5);
    JVar2.ptr = (void *)((ulong)JVar6.u.ptr & 0xffffffff | uVar3);
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_array_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, method, ret;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    method = JS_GetProperty(ctx, obj, JS_ATOM_join);
    if (JS_IsException(method)) {
        ret = JS_EXCEPTION;
    } else
    if (!JS_IsFunction(ctx, method)) {
        /* Use intrinsic Object.prototype.toString */
        JS_FreeValue(ctx, method);
        ret = js_object_toString(ctx, obj, 0, NULL);
    } else {
        ret = JS_CallFree(ctx, method, obj, 0, NULL);
    }
    JS_FreeValue(ctx, obj);
    return ret;
}